

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

int av1_apply_selfguided_restoration_c
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  uint16_t uVar1;
  undefined1 *puVar2;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int *in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000028;
  uint16_t out;
  int16_t w;
  int32_t v;
  int32_t u;
  uint16_t pre_u;
  uint8_t *dat8ij;
  uint8_t *dst8ij;
  int k;
  int j;
  int i;
  int xq [2];
  sgr_params_type *params;
  int ret;
  int32_t *flt1;
  int32_t *flt0;
  int32_t *in_stack_00007e20;
  int32_t *in_stack_00007e28;
  int in_stack_00007e34;
  int in_stack_00007e38;
  int in_stack_00007e3c;
  uint8_t *in_stack_00007e40;
  int in_stack_00007e50;
  int in_stack_00007e58;
  int in_stack_00007e60;
  int in_stack_00007e68;
  int in_stack_ffffffffffffff4c;
  int local_60;
  int local_5c;
  int local_58 [2];
  sgr_params_type *local_50;
  int local_44;
  long local_40;
  int *local_30;
  int local_28;
  int local_20;
  int local_1c;
  int local_c;
  
  local_40 = in_stack_00000018 + 0x9dcd0;
  local_30 = in_R9;
  local_28 = in_R8D;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_44 = av1_selfguided_restoration_c
                       (in_stack_00007e40,in_stack_00007e3c,in_stack_00007e38,in_stack_00007e34,
                        in_stack_00007e28,in_stack_00007e20,in_stack_00007e50,in_stack_00007e58,
                        in_stack_00007e60,in_stack_00007e68);
  local_c = local_44;
  if (local_44 == 0) {
    local_50 = av1_sgr_params + local_28;
    av1_decode_xq(local_30,local_58,local_50);
    for (local_5c = 0; local_5c < local_20; local_5c = local_5c + 1) {
      for (local_60 = 0; local_60 < local_1c; local_60 = local_60 + 1) {
        puVar2 = (undefined1 *)(in_stack_00000008 + local_5c * in_stack_00000010 + (long)local_60);
        uVar1 = clip_pixel_highbd(in_R8D,in_stack_ffffffffffffff4c);
        if (in_stack_00000028 == 0) {
          *puVar2 = (char)uVar1;
        }
        else {
          *(uint16_t *)((long)puVar2 * 2) = uVar1;
        }
      }
    }
    local_c = 0;
  }
  return local_c;
}

Assistant:

int av1_apply_selfguided_restoration_c(const uint8_t *dat8, int width,
                                       int height, int stride, int eps,
                                       const int *xqd, uint8_t *dst8,
                                       int dst_stride, int32_t *tmpbuf,
                                       int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);

  const int ret = av1_selfguided_restoration_c(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int k = i * width + j;
      uint8_t *dst8ij = dst8 + i * dst_stride + j;
      const uint8_t *dat8ij = dat8 + i * stride + j;

      const uint16_t pre_u = highbd ? *CONVERT_TO_SHORTPTR(dat8ij) : *dat8ij;
      const int32_t u = (int32_t)pre_u << SGRPROJ_RST_BITS;
      int32_t v = u << SGRPROJ_PRJ_BITS;
      // If params->r == 0 then we skipped the filtering in
      // av1_selfguided_restoration_c, i.e. flt[k] == u
      if (params->r[0] > 0) v += xq[0] * (flt0[k] - u);
      if (params->r[1] > 0) v += xq[1] * (flt1[k] - u);
      const int16_t w =
          (int16_t)ROUND_POWER_OF_TWO(v, SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      const uint16_t out = clip_pixel_highbd(w, bit_depth);
      if (highbd)
        *CONVERT_TO_SHORTPTR(dst8ij) = out;
      else
        *dst8ij = (uint8_t)out;
    }
  }
  return 0;
}